

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::TypeManager::CreateDecoration
          (TypeManager *this,uint32_t target,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration,bool is_member,
          uint32_t element)

{
  pointer puVar1;
  IRContext *this_00;
  Instruction *inst;
  TypeManager *pTVar2;
  DefUseManager *this_01;
  undefined7 in_register_00000009;
  size_t i;
  ulong uVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  Op local_c0;
  uint local_bc;
  TypeManager *local_b8;
  int local_b0 [2];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_c0;
  local_c0 = target;
  local_b8 = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&ops,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  local_bc = (uint)CONCAT71(in_register_00000009,is_member);
  if (local_bc != 0) {
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_c0;
    local_c0 = element;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&ops,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  local_c0 = *(decoration->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_c0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
  local_88.type = SPV_OPERAND_TYPE_DECORATION;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&ops,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  for (uVar3 = 1; pTVar2 = local_b8,
      puVar1 = (decoration->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
               .super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(decoration->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar3 = uVar3 + 1) {
    local_c0 = puVar1[uVar3];
    init_list_02._M_len = 1;
    init_list_02._M_array = &local_c0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_02);
    local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&ops,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  this_00 = local_b8->context_;
  local_c0 = (local_bc & 0xff) + OpDecorate;
  local_b0[1] = 0;
  local_b0[0] = 0;
  local_58._vptr_SmallVector = (_func_int **)this_00;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
            ((spvtools *)&local_88,(IRContext **)&local_58,&local_c0,local_b0 + 1,local_b0,&ops);
  IRContext::AddAnnotationInst
            (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_88);
  if ((long *)CONCAT44(local_88._4_4_,local_88.type) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_88._4_4_,local_88.type) + 8))();
  }
  inst = *(Instruction **)
          ((long)&(((pTVar2->context_->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18);
  this_01 = IRContext::get_def_use_mgr(pTVar2->context_);
  DefUseManager::AnalyzeInstUse(this_01,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&ops);
  return;
}

Assistant:

void TypeManager::CreateDecoration(uint32_t target,
                                   const std::vector<uint32_t>& decoration,
                                   bool is_member, uint32_t element) {
  std::vector<Operand> ops;
  ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {target}));
  if (is_member) {
    ops.push_back(Operand(SPV_OPERAND_TYPE_LITERAL_INTEGER, {element}));
  }
  ops.push_back(Operand(SPV_OPERAND_TYPE_DECORATION, {decoration[0]}));
  for (size_t i = 1; i < decoration.size(); ++i) {
    ops.push_back(Operand(SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration[i]}));
  }
  context()->AddAnnotationInst(MakeUnique<Instruction>(
      context(), (is_member ? spv::Op::OpMemberDecorate : spv::Op::OpDecorate),
      0, 0, ops));
  Instruction* inst = &*--context()->annotation_end();
  context()->get_def_use_mgr()->AnalyzeInstUse(inst);
}